

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O1

void __thiscall vera::Vbo::setDrawType(Vbo *this,GLenum _drawType)

{
  if ((8 < _drawType - 0x88e0) || ((0x111U >> (_drawType - 0x88e0 & 0x1f) & 1) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid draw type for mesh! Defaulting to GL_STATIC_DRAW",0x38
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    _drawType = 0x88e4;
  }
  this->m_drawType = _drawType;
  return;
}

Assistant:

void Vbo::setDrawType(GLenum _drawType) {
    switch (_drawType) {
        case GL_STREAM_DRAW:
        case GL_STATIC_DRAW:
        case GL_DYNAMIC_DRAW:
            m_drawType = _drawType;
            break;
        default:
            std::cout << "Invalid draw type for mesh! Defaulting to GL_STATIC_DRAW" << std::endl;
            m_drawType = GL_STATIC_DRAW;
    }
}